

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

void protodec_reset(demod_state_t *d)

{
  d->state = 1;
  d->antallpreamble = 0;
  d->bitstuff = 0;
  d->last = '\0';
  d->bufferpos = 0;
  d->nskurr = 0;
  d->npreamble = 0;
  d->nstartsign = 0;
  d->ndata = 0;
  d->nstopsign = 0;
  d->antallenner = 0;
  return;
}

Assistant:

void protodec_reset(struct demod_state_t *d)
{
	d->state = ST_SKURR;
	d->nskurr = 0;
	d->ndata = 0;
	d->npreamble = 0;
	d->nstartsign = 0;
	d->nstopsign = 0;
	d->antallpreamble = 0;
	d->antallenner = 0;
	d->last = 0;
	d->bitstuff = 0;
	d->bufferpos = 0;
}